

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O3

ROMInfo ** MT32Emu::ROMInfo::getROMInfoList(Bit32u types,Bit32u pairTypes)

{
  ROMInfo *pRVar1;
  ROMInfo **ppRVar2;
  long lVar3;
  long lVar4;
  undefined **ppuVar5;
  undefined8 *puVar6;
  ROMInfo **ppRVar7;
  undefined1 *puVar8;
  byte bVar9;
  
  bVar9 = 0;
  puVar8 = (undefined1 *)getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_;
  if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
    puVar8 = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
    getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
    getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
    getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
    getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
    getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
    ppuVar5 = &getROMInfoLists()::FULL_ROM_INFOS;
    puVar6 = &getROMInfoLists()::ALL_ROM_INFOS;
    for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *ppuVar5;
      ppuVar5 = ppuVar5 + 1;
      puVar6 = puVar6 + 1;
    }
    ppuVar5 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
    puVar6 = &DAT_001359d0;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *ppuVar5;
      ppuVar5 = ppuVar5 + 1;
      puVar6 = puVar6 + 1;
    }
  }
  ppRVar2 = (ROMInfo **)operator_new__(0xe8);
  lVar3 = 0;
  ppRVar7 = ppRVar2;
  do {
    if (puVar8 == (undefined1 *)0x0) {
      getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
      getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
      getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
      getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
      getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
      getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
      getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
      ppuVar5 = &getROMInfoLists()::FULL_ROM_INFOS;
      puVar6 = &getROMInfoLists()::ALL_ROM_INFOS;
      for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *ppuVar5;
        ppuVar5 = ppuVar5 + (ulong)bVar9 * -2 + 1;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      }
      ppuVar5 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
      puVar6 = &DAT_001359d0;
      for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar6 = *ppuVar5;
        ppuVar5 = ppuVar5 + (ulong)bVar9 * -2 + 1;
        puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
      }
      puVar8 = getROMInfoLists()::CTRL_MT32_V1_04_B;
    }
    pRVar1 = *(ROMInfo **)((long)&getROMInfoLists()::ALL_ROM_INFOS + lVar3);
    if (((types >> (pRVar1->type & 0x1f) & 1) != 0) &&
       ((pairTypes >> (pRVar1->pairType & 0x1f) & 1) != 0)) {
      *ppRVar7 = pRVar1;
      ppRVar7 = ppRVar7 + 1;
      puVar8 = (undefined1 *)getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0xe0);
  *ppRVar7 = (ROMInfo *)0x0;
  return ppRVar2;
}

Assistant:

const ROMInfo **ROMInfo::getROMInfoList(Bit32u types, Bit32u pairTypes) {
	Bit32u romCount = getROMInfoLists().allROMInfos.itemCount; // Excludes the NULL terminator.
	const ROMInfo **romInfoList = new const ROMInfo*[romCount + 1];
	const ROMInfo **currentROMInList = romInfoList;
	for (Bit32u i = 0; i < romCount; i++) {
		const ROMInfo *romInfo = getKnownROMInfoFromList(i);
		if ((types & (1 << romInfo->type)) && (pairTypes & (1 << romInfo->pairType))) {
			*currentROMInList++ = romInfo;
		}
	}
	*currentROMInList = NULL;
	return romInfoList;
}